

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cc
# Opt level: O0

ostream * operator<<(ostream *out,Node *node)

{
  bool bVar1;
  reference ppOVar2;
  ostream *this;
  _Self local_30;
  _Self local_28;
  iter ii;
  list<const_Operation_*,_std::allocator<const_Operation_*>_> *steps;
  Node *node_local;
  ostream *out_local;
  
  ii._M_node = (_List_node_base *)Node::steps_abi_cxx11_(node);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::begin
                 ((list<const_Operation_*,_std::allocator<const_Operation_*>_> *)ii._M_node);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::end(ii._M_node);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppOVar2 = std::_List_const_iterator<const_Operation_*>::operator*(&local_28);
    this = operator<<(out,*ppOVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::_List_const_iterator<const_Operation_*>::operator++(&local_28);
  }
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const Node &node)
{
	typedef list<const Operation *>::const_iterator iter;
	const list<const Operation *>&steps = node.steps();
	for (iter ii = steps.begin(); ii != steps.end(); ++ii)
		out << *(*ii) << endl;
	return out;
}